

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O2

bool __thiscall BamTools::SplitTool::SplitToolPrivate::Run(SplitToolPrivate *this)

{
  SplitSettings *pSVar1;
  bool bVar2;
  ostream *poVar3;
  
  DetermineOutputFilenameStub(this);
  bVar2 = OpenReader(this);
  if (bVar2) {
    pSVar1 = this->m_settings;
    if (pSVar1->IsSplittingMapped == true) {
      bVar2 = SplitMapped(this);
      return bVar2;
    }
    if (pSVar1->IsSplittingPaired == true) {
      bVar2 = SplitPaired(this);
      return bVar2;
    }
    if (pSVar1->IsSplittingReference == true) {
      bVar2 = SplitReference(this);
      return bVar2;
    }
    if (pSVar1->IsSplittingTag == true) {
      bVar2 = SplitTag(this);
      return bVar2;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "bamtools split ERROR: no property given to split on... ");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,
                             "Please use -mapped, -paired, -reference, or -tag TAG to specify desired split behavior."
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return false;
}

Assistant:

bool SplitTool::SplitToolPrivate::Run()
{

    // determine output stub
    DetermineOutputFilenameStub();

    // open up BamReader
    if (!OpenReader()) return false;

    // determine split type from settings
    if (m_settings->IsSplittingMapped) return SplitMapped();
    if (m_settings->IsSplittingPaired) return SplitPaired();
    if (m_settings->IsSplittingReference) return SplitReference();
    if (m_settings->IsSplittingTag) return SplitTag();

    // if we get here, no property was specified
    std::cerr
        << "bamtools split ERROR: no property given to split on... " << std::endl
        << "Please use -mapped, -paired, -reference, or -tag TAG to specify desired split behavior."
        << std::endl;
    return false;
}